

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O1

void duckdb::BinaryExecutor::
     ExecuteFlatLoop<duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::uhugeint_t,duckdb::BinaryStandardOperatorWrapper,duckdb::BitwiseShiftRightOperator,bool,false,true>
               (uhugeint_t *ldata,uhugeint_t *rdata,uhugeint_t *result_data,idx_t count,
               ValidityMask *mask,bool fun)

{
  uint64_t *puVar1;
  unsigned_long *puVar2;
  uint64_t uVar3;
  uint64_t uVar4;
  uhugeint_t shift;
  uhugeint_t shift_00;
  bool bVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  unsigned_long uVar9;
  ulong uVar10;
  long lVar11;
  uhugeint_t uVar12;
  uint64_t in_stack_ffffffffffffff68;
  uint64_t uStack_90;
  uhugeint_t local_80;
  uhugeint_t *local_70;
  uhugeint_t *local_68;
  uhugeint_t *local_60;
  uhugeint_t local_58;
  ulong local_48;
  ulong local_40;
  ValidityMask *local_38;
  
  local_70 = rdata;
  local_68 = ldata;
  local_60 = result_data;
  local_38 = mask;
  if ((mask->super_TemplatedValidityMask<unsigned_long>).validity_mask == (unsigned_long *)0x0) {
    if (count != 0) {
      uVar3 = rdata->lower;
      uVar4 = rdata->upper;
      lVar11 = 0;
      do {
        puVar1 = (uint64_t *)((long)&local_68->lower + lVar11);
        local_58.lower = *puVar1;
        local_58.upper = puVar1[1];
        uVar12.upper = in_stack_ffffffffffffff68;
        uVar12.lower = 0x1b346a6;
        local_80.lower = uVar3;
        local_80.upper = uVar4;
        bVar5 = RightShiftInRange<duckdb::uhugeint_t>(uVar12);
        if (bVar5) {
          uVar12 = uhugeint_t::operator>>(&local_58,&local_80);
          in_stack_ffffffffffffff68 = uVar12.lower;
          uStack_90 = uVar12.upper;
        }
        else {
          uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffff68,0);
        }
        puVar1 = (uint64_t *)((long)&local_60->lower + lVar11);
        *puVar1 = in_stack_ffffffffffffff68;
        puVar1[1] = uStack_90;
        lVar11 = lVar11 + 0x10;
        count = count - 1;
      } while (count != 0);
    }
  }
  else if (0x3f < count + 0x3f) {
    local_48 = count + 0x3f >> 6;
    uVar8 = 0;
    uVar6 = 0;
    local_40 = count;
    do {
      puVar2 = (local_38->super_TemplatedValidityMask<unsigned_long>).validity_mask;
      if (puVar2 == (unsigned_long *)0x0) {
        uVar9 = 0xffffffffffffffff;
      }
      else {
        uVar9 = puVar2[uVar8];
      }
      uVar10 = uVar6 + 0x40;
      if (local_40 <= uVar6 + 0x40) {
        uVar10 = local_40;
      }
      uVar7 = uVar10;
      if (uVar9 != 0) {
        uVar7 = uVar6;
        if (uVar9 == 0xffffffffffffffff) {
          if (uVar6 < uVar10) {
            uVar3 = local_70->lower;
            uVar4 = local_70->upper;
            lVar11 = uVar6 << 4;
            do {
              puVar1 = (uint64_t *)((long)&local_68->lower + lVar11);
              local_58.lower = *puVar1;
              local_58.upper = puVar1[1];
              shift.upper = in_stack_ffffffffffffff68;
              shift.lower = 0x1b34576;
              local_80.lower = uVar3;
              local_80.upper = uVar4;
              bVar5 = RightShiftInRange<duckdb::uhugeint_t>(shift);
              if (bVar5) {
                uVar12 = uhugeint_t::operator>>(&local_58,&local_80);
                in_stack_ffffffffffffff68 = uVar12.lower;
                uStack_90 = uVar12.upper;
              }
              else {
                uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffff68,0);
              }
              puVar1 = (uint64_t *)((long)&local_60->lower + lVar11);
              *puVar1 = in_stack_ffffffffffffff68;
              puVar1[1] = uStack_90;
              uVar7 = uVar7 + 1;
              lVar11 = lVar11 + 0x10;
            } while (uVar10 != uVar7);
          }
        }
        else if (uVar6 < uVar10) {
          lVar11 = uVar6 << 4;
          uVar7 = 0;
          do {
            if ((uVar9 >> (uVar7 & 0x3f) & 1) != 0) {
              local_80.lower = local_70->lower;
              local_80.upper = local_70->upper;
              puVar1 = (uint64_t *)((long)&local_68->lower + lVar11);
              local_58.lower = *puVar1;
              local_58.upper = puVar1[1];
              shift_00.upper = in_stack_ffffffffffffff68;
              shift_00.lower = 0x1b3460b;
              bVar5 = RightShiftInRange<duckdb::uhugeint_t>(shift_00);
              if (bVar5) {
                uVar12 = uhugeint_t::operator>>(&local_58,&local_80);
                in_stack_ffffffffffffff68 = uVar12.lower;
                uStack_90 = uVar12.upper;
              }
              else {
                uhugeint_t::uhugeint_t((uhugeint_t *)&stack0xffffffffffffff68,0);
              }
              puVar1 = (uint64_t *)((long)&local_60->lower + lVar11);
              *puVar1 = in_stack_ffffffffffffff68;
              puVar1[1] = uStack_90;
            }
            uVar7 = uVar7 + 1;
            lVar11 = lVar11 + 0x10;
          } while ((uVar6 - uVar10) + uVar7 != 0);
          uVar7 = uVar6 + uVar7;
        }
      }
      uVar8 = uVar8 + 1;
      uVar6 = uVar7;
    } while (uVar8 != local_48);
  }
  return;
}

Assistant:

static void ExecuteFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                            RESULT_TYPE *__restrict result_data, idx_t count, ValidityMask &mask, FUNC fun) {
		if (!LEFT_CONSTANT) {
			ASSERT_RESTRICT(ldata, ldata + count, result_data, result_data + count);
		}
		if (!RIGHT_CONSTANT) {
			ASSERT_RESTRICT(rdata, rdata + count, result_data, result_data + count);
		}

		if (!mask.AllValid()) {
			idx_t base_idx = 0;
			auto entry_count = ValidityMask::EntryCount(count);
			for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
				auto validity_entry = mask.GetValidityEntry(entry_idx);
				idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
				if (ValidityMask::AllValid(validity_entry)) {
					// all valid: perform operation
					for (; base_idx < next; base_idx++) {
						auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
						auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
						result_data[base_idx] =
						    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
						        fun, lentry, rentry, mask, base_idx);
					}
				} else if (ValidityMask::NoneValid(validity_entry)) {
					// nothing valid: skip all
					base_idx = next;
					continue;
				} else {
					// partially valid: need to check individual elements for validity
					idx_t start = base_idx;
					for (; base_idx < next; base_idx++) {
						if (ValidityMask::RowIsValid(validity_entry, base_idx - start)) {
							auto lentry = ldata[LEFT_CONSTANT ? 0 : base_idx];
							auto rentry = rdata[RIGHT_CONSTANT ? 0 : base_idx];
							result_data[base_idx] =
							    OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
							        fun, lentry, rentry, mask, base_idx);
						}
					}
				}
			}
		} else {
			for (idx_t i = 0; i < count; i++) {
				auto lentry = ldata[LEFT_CONSTANT ? 0 : i];
				auto rentry = rdata[RIGHT_CONSTANT ? 0 : i];
				result_data[i] = OPWRAPPER::template Operation<FUNC, OP, LEFT_TYPE, RIGHT_TYPE, RESULT_TYPE>(
				    fun, lentry, rentry, mask, i);
			}
		}
	}